

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O1

unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
* __thiscall
HuffTree::get_alphabet
          (unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
           *__return_storage_ptr__,HuffTree *this)

{
  TreeNode *__k;
  mapped_type *this_00;
  _Elt_pointer ppVar1;
  bool bVar2;
  stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
  s;
  pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_> local_e8;
  vector<bool,_std::allocator<bool>_> local_b8;
  _Deque_base<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  local_88;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  if ((this->root)._M_t.
      super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl != (TreeNode *)0x0) {
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::
    _Deque_base<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>
    ::_M_initialize_map(&local_88,0);
    local_e8.first =
         (this->root)._M_t.
         super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
         super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
         super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
    std::vector<bool,_std::allocator<bool>_>::vector(&local_e8.second,&local_b8);
    std::
    deque<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>,std::allocator<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>>>
    ::emplace_back<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>>
              ((deque<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>,std::allocator<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>>>
                *)&local_88,&local_e8);
    if (local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        ppVar1 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar1 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
        }
        __k = ppVar1[-1].first;
        std::vector<bool,_std::allocator<bool>_>::operator=(&local_b8,&ppVar1[-1].second);
        std::
        deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>
        ::pop_back((deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                    *)&local_88);
        if (__k->_is_leaf == true) {
          this_00 = std::__detail::
                    _Map_base<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)__return_storage_ptr__,&__k->_data);
          std::vector<bool,_std::allocator<bool>_>::operator=(this_00,&local_b8);
        }
        if ((__k->_left)._M_t.
            super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t
            .super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
            super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl != (TreeNode *)0x0) {
          std::vector<bool,_std::allocator<bool>_>::push_back(&local_b8,false);
          local_e8.first =
               (__k->_left)._M_t.
               super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>
               .super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
          std::vector<bool,_std::allocator<bool>_>::vector(&local_e8.second,&local_b8);
          std::
          deque<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>,std::allocator<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>>>
          ::emplace_back<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>>
                    ((deque<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>,std::allocator<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>>>
                      *)&local_88,&local_e8);
          if (local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_end_of_storage -
                            (long)local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          bVar2 = local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
          local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset =
               local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_offset - 1;
          if (bVar2) {
            local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
            local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p =
                 local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + -1;
          }
        }
        if ((__k->_right)._M_t.
            super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t
            .super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
            super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl != (TreeNode *)0x0) {
          std::vector<bool,_std::allocator<bool>_>::push_back(&local_b8,true);
          local_e8.first =
               (__k->_right)._M_t.
               super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>
               .super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
          std::vector<bool,_std::allocator<bool>_>::vector(&local_e8.second,&local_b8);
          std::
          deque<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>,std::allocator<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>>>
          ::emplace_back<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>>
                    ((deque<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>,std::allocator<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>>>
                      *)&local_88,&local_e8);
          if (local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_end_of_storage -
                            (long)local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_e8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          bVar2 = local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
          local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset =
               local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_offset - 1;
          if (bVar2) {
            local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
            local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p =
                 local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + -1;
          }
        }
      } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    std::
    deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>
    ::~deque((deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>
              *)&local_88);
    if (local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<char, std::vector<bool>> HuffTree::get_alphabet() {
    std::unordered_map<char, std::vector<bool>> alphabet;

    if (root) {
        std::vector<bool> code = {};
        std::stack<std::pair<TreeNode *, std::vector<bool>>> s;
        s.push({root.get(), code});
        while (!s.empty()) {
            TreeNode *node;
            std::tie(node, code) = s.top();
            s.pop();
            if (node->_is_leaf) {
                alphabet[node->_data] = code;
            }
            if (node->_left) {
                code.push_back(false);
                s.push({node->_left.get(), code});
                code.pop_back();
            }
            if (node->_right) {
                code.push_back(true);
                s.push({node->_right.get(), code});
                code.pop_back();
            }
        }
    }
    return alphabet;
}